

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PipelineResourceSignatureBase.hpp
# Opt level: O0

IShaderResourceVariable * __thiscall
Diligent::PipelineResourceSignatureBase<Diligent::EngineGLImplTraits>::GetStaticVariableByName
          (PipelineResourceSignatureBase<Diligent::EngineGLImplTraits> *this,SHADER_TYPE ShaderType,
          Char *Name)

{
  undefined *puVar1;
  bool bVar2;
  Int32 IVar3;
  uint uVar4;
  Uint32 UVar5;
  undefined8 uVar6;
  reference pvVar7;
  Char *Message;
  char (*in_stack_ffffffffffffff48) [3];
  undefined1 local_98 [8];
  string msg;
  int VarMngrInd;
  Int32 ShaderTypeInd;
  char *local_60;
  Char *local_58;
  undefined1 local_50 [8];
  string _msg;
  Char *Name_local;
  SHADER_TYPE ShaderType_local;
  PipelineResourceSignatureBase<Diligent::EngineGLImplTraits> *this_local;
  
  _msg.field_2._8_8_ = Name;
  bVar2 = IsConsistentShaderType(ShaderType,this->m_PipelineType);
  if (bVar2) {
    IVar3 = GetShaderTypePipelineIndex(ShaderType,this->m_PipelineType);
    pvVar7 = std::array<signed_char,_6UL>::operator[](&this->m_StaticResStageIndex,(long)IVar3);
    uVar4 = (uint)*pvVar7;
    if ((int)uVar4 < 0) {
      this_local = (PipelineResourceSignatureBase<Diligent::EngineGLImplTraits> *)0x0;
    }
    else {
      msg.field_2._12_4_ = uVar4;
      UVar5 = GetNumStaticResStages(this);
      if (UVar5 <= uVar4) {
        FormatString<char[26],char[58]>
                  ((string *)local_98,(Diligent *)"Debug expression failed:\n",
                   (char (*) [26])"static_cast<Uint32>(VarMngrInd) < GetNumStaticResStages()",
                   (char (*) [58])(ulong)UVar5);
        Message = (Char *)std::__cxx11::string::c_str();
        DebugAssertionFailed
                  (Message,"GetStaticVariableByName",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/PipelineResourceSignatureBase.hpp"
                   ,0x1dd);
        std::__cxx11::string::~string((string *)local_98);
      }
      this_local = (PipelineResourceSignatureBase<Diligent::EngineGLImplTraits> *)
                   ShaderVariableManagerGL::GetVariable
                             (this->m_StaticVarsMgrs + (int)msg.field_2._12_4_,
                              (Char *)_msg.field_2._8_8_);
    }
  }
  else {
    local_58 = GetShaderTypeLiteralName(ShaderType);
    local_60 = GetPipelineTypeString(this->m_PipelineType);
    FormatString<char[33],char_const*,char[19],char_const*,char[30],char_const*,char[31],char_const*,char[3]>
              ((string *)local_50,(Diligent *)"Unable to find static variable \'",
               (char (*) [33])((long)&_msg.field_2 + 8),(char **)"\' in shader stage ",
               (char (*) [19])&local_58,(char **)" as the stage is invalid for ",
               (char (*) [30])&local_60,(char **)0x48a6bc,
               (char (*) [31])
               &(this->
                super_DeviceObjectBase<Diligent::IPipelineResourceSignature,_Diligent::RenderDeviceGLImpl,_Diligent::PipelineResourceSignatureDesc>
                ).m_Desc,(char **)"\'.",in_stack_ffffffffffffff48);
    puVar1 = DebugMessageCallback;
    if (DebugMessageCallback != (undefined *)0x0) {
      uVar6 = std::__cxx11::string::c_str();
      (*(code *)puVar1)(1,uVar6,0);
    }
    std::__cxx11::string::~string((string *)local_50);
    this_local = (PipelineResourceSignatureBase<Diligent::EngineGLImplTraits> *)0x0;
  }
  return (IShaderResourceVariable *)this_local;
}

Assistant:

GetStaticVariableByName(SHADER_TYPE ShaderType,
                                                                                const Char* Name) override final
    {
        if (!IsConsistentShaderType(ShaderType, m_PipelineType))
        {
            LOG_WARNING_MESSAGE("Unable to find static variable '", Name, "' in shader stage ", GetShaderTypeLiteralName(ShaderType),
                                " as the stage is invalid for ", GetPipelineTypeString(m_PipelineType), " pipeline resource signature '", this->m_Desc.Name, "'.");
            return nullptr;
        }

        const Int32 ShaderTypeInd = GetShaderTypePipelineIndex(ShaderType, m_PipelineType);
        const int   VarMngrInd    = m_StaticResStageIndex[ShaderTypeInd];
        if (VarMngrInd < 0)
            return nullptr;

        VERIFY_EXPR(static_cast<Uint32>(VarMngrInd) < GetNumStaticResStages());
        return m_StaticVarsMgrs[VarMngrInd].GetVariable(Name);
    }